

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_relation.cpp
# Opt level: O1

void __thiscall
duckdb::ValueRelation::ValueRelation
          (ValueRelation *this,shared_ptr<duckdb::RelationContextWrapper,_true> *context,
          vector<duckdb::vector<duckdb::Value,_true>,_true> *values,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names_p,string *alias_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  undefined8 uVar4;
  const_reference this_00;
  const_reference other;
  tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> this_01;
  size_type __n;
  size_type __n_00;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  expressions;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_c0
  ;
  vector<duckdb::vector<duckdb::Value,_true>,_true> *local_b8;
  vector<duckdb::ColumnDefinition,_true> *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_a8;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>>
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  Value local_70;
  
  local_b8 = values;
  local_70.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_70 + 0x10U);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,anon_var_dwarf_647c332 + 9);
  Relation::Relation(&this->super_Relation,context,VALUE_LIST_RELATION,(string *)&local_70);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_70.type_._0_8_ !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_70 + 0x10U)) {
    operator_delete((void *)local_70.type_._0_8_);
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__ValueRelation_019d00e0;
  (this->expressions).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expressions).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expressions).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar3 = (names_p->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (names_p->
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (names_p->
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (names_p->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (names_p->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (names_p->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98 = &(this->alias).field_2;
  (this->alias)._M_dataplus._M_p = (pointer)local_98;
  pcVar2 = (alias_p->_M_dataplus)._M_p;
  paVar1 = &alias_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar4 = *(undefined8 *)((long)&alias_p->field_2 + 8);
    local_98->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->alias).field_2 + 8) = uVar4;
  }
  else {
    (this->alias)._M_dataplus._M_p = pcVar2;
    (this->alias).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_a0 = (vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>>
              *)&this->expressions;
  local_a8 = &this->names;
  local_b0 = &this->columns;
  (this->alias)._M_string_length = alias_p->_M_string_length;
  (alias_p->_M_dataplus)._M_p = (pointer)paVar1;
  alias_p->_M_string_length = 0;
  (alias_p->field_2)._M_local_buf[0] = '\0';
  if ((local_b8->
      super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
      ).
      super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_b8->
      super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
      ).
      super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      local_90 = __n;
      this_00 = vector<duckdb::vector<duckdb::Value,_true>,_true>::operator[](local_b8,__n);
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      if ((this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n_00 = 0;
        do {
          other = vector<duckdb::Value,_true>::operator[](this_00,__n_00);
          this_01.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                )operator_new(0x78);
          Value::Value(&local_70,other);
          ConstantExpression::ConstantExpression
                    ((ConstantExpression *)
                     this_01.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
                     &local_70);
          Value::~Value(&local_70);
          local_c0._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
               (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
               this_01.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&local_88,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_c0);
          if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               )local_c0._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
              (ParsedExpression *)0x0) {
            (**(code **)(*(long *)local_c0._M_t.
                                  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                  _M_head_impl + 8))();
          }
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)((long)(this_00->
                                        super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                                        .
                                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->
                                        super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                                        .
                                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 6));
      }
      ::std::
      vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>>
      ::
      emplace_back<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                (local_a0,(vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                           *)&local_88);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&local_88);
      __n = local_90 + 1;
    } while (__n < (ulong)(((long)(local_b8->
                                  super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
                                  ).
                                  super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_b8->
                                  super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
                                  ).
                                  super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  QueryResult::DeduplicateColumns(local_a8);
  Relation::TryBindRelation(&this->super_Relation,local_b0);
  return;
}

Assistant:

ValueRelation::ValueRelation(const shared_ptr<RelationContextWrapper> &context, const vector<vector<Value>> &values,
                             vector<string> names_p, string alias_p)
    : Relation(context, RelationType::VALUE_LIST_RELATION), names(std::move(names_p)), alias(std::move(alias_p)) {
	// create constant expressions for the values
	for (idx_t row_idx = 0; row_idx < values.size(); row_idx++) {
		auto &list = values[row_idx];
		vector<unique_ptr<ParsedExpression>> expressions;
		for (idx_t col_idx = 0; col_idx < list.size(); col_idx++) {
			expressions.push_back(make_uniq<ConstantExpression>(list[col_idx]));
		}
		this->expressions.push_back(std::move(expressions));
	}
	QueryResult::DeduplicateColumns(names);
	TryBindRelation(columns);
}